

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O2

shared_ptr<AvlTree<int>::Node> __thiscall
AvlTree<int>::_rightRotate(AvlTree<int> *this,shared_ptr<AvlTree<int>::Node> *node)

{
  __shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar1;
  int iVar2;
  int iVar3;
  shared_ptr<AvlTree<int>::Node> sVar4;
  long local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  long local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<AvlTree<int>::Node> T2;
  
  std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(in_RDX->_M_ptr->left).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>,
             &(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->right).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->right).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>,
             in_RDX);
  std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(in_RDX->_M_ptr->left).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>,
             &T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(in_RDX->_M_ptr->left).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = 0;
  iVar3 = 0;
  if (local_48 != 0) {
    iVar3 = *(int *)(local_48 + 0x28);
  }
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(in_RDX->_M_ptr->right).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_58 != 0) {
    iVar1 = *(int *)(local_58 + 0x28);
  }
  if (iVar1 < iVar3) {
    iVar1 = iVar3;
  }
  in_RDX->_M_ptr->height = iVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(in_RDX->_M_ptr->left).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_48 == 0) {
    iVar3 = 1;
  }
  else {
    iVar3 = *(int *)(local_48 + 0x2c) + 1;
  }
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(in_RDX->_M_ptr->right).
              super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = 0;
  iVar1 = 0;
  if (local_58 != 0) {
    iVar1 = *(int *)(local_58 + 0x2c);
  }
  in_RDX->_M_ptr->size = iVar3 + iVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->left).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_48 != 0) {
    iVar2 = *(int *)(local_48 + 0x28);
  }
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->right).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_58 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *(int *)(local_58 + 0x28);
  }
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  ((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->height
       = iVar3 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->left).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_48 == 0) {
    iVar3 = 1;
  }
  else {
    iVar3 = *(int *)(local_48 + 0x2c) + 1;
  }
  std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AvlTree<int>::Node,void>
            ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->right).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>);
  if (local_58 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = *(int *)(local_58 + 0x2c);
  }
  ((this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size =
       iVar3 + iVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<int>::Node>)
         sVar4.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _rightRotate(std::shared_ptr<Node>& node)
    {
        auto x = node->left;
        auto T2 = x->right;

        // Perform rotation
        x->right = node;
        node->left = T2;

        // Update node values
        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        x->height = std::max(_height(x->left), _height(x->right)) + 1;
        x->size = _size(x->left) + _size(x->right) + 1;

        // Return new root
        return x;
    }